

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O1

uint32_t __thiscall
cfd::TransactionContext::GetTxInIndex(TransactionContext *this,OutPoint *outpoint)

{
  undefined4 uVar1;
  uint32_t uVar2;
  undefined **local_30;
  void *local_28;
  
  cfd::core::OutPoint::GetTxid();
  uVar1 = cfd::core::OutPoint::GetVout();
  uVar2 = (**(code **)(*(long *)this + 0x10))(this,&local_30,uVar1);
  local_30 = &PTR__Txid_002b2f00;
  if (local_28 != (void *)0x0) {
    operator_delete(local_28);
  }
  return uVar2;
}

Assistant:

uint32_t TransactionContext::GetTxInIndex(const OutPoint& outpoint) const {
  return GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
}